

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.h
# Opt level: O2

VertexOutEdgeIds __thiscall
S2Builder::Graph::VertexOutMap::edge_ids(VertexOutMap *this,VertexId v0,VertexId v1)

{
  pointer piVar1;
  pointer ppVar2;
  pair<const_std::pair<int,_int>_*,_const_std::pair<int,_int>_*> pVar3;
  VertexId local_10;
  VertexId local_c;
  
  piVar1 = (this->edge_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar2 = (this->edges_->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_10 = v0;
  local_c = v1;
  pVar3 = std::
          __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                    (ppVar2 + piVar1[v0],ppVar2 + piVar1[(long)v0 + 1],&local_10);
  ppVar2 = (this->edges_->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  return (VertexOutEdgeIds)
         ((ulong)((long)pVar3.first - (long)ppVar2) >> 3 & 0xffffffff |
         ((long)pVar3.second - (long)ppVar2 & 0xfffffffffffffff8U) << 0x1d);
}

Assistant:

inline S2Builder::Graph::VertexOutEdgeIds
S2Builder::Graph::VertexOutMap::edge_ids(VertexId v0, VertexId v1) const {
  auto range = std::equal_range(edges_->data() + edge_begins_[v0],
                                edges_->data() + edge_begins_[v0 + 1],
                                Edge(v0, v1));
  return VertexOutEdgeIds(
      static_cast<S2Builder::Graph::EdgeId>(range.first - edges_->data()),
      static_cast<S2Builder::Graph::EdgeId>(range.second - edges_->data()));
}